

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

uint64_t getVoronoiSHA(uint64_t seed)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint auStack_174 [8];
  int aiStack_154 [5];
  uint auStack_140 [68];
  
  uVar2 = (uint)seed;
  auStack_140[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (uint)(seed >> 0x20);
  auStack_140[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  auStack_140[4] = 0x80000000;
  for (lVar9 = 3; lVar9 != 0xf; lVar9 = lVar9 + 1) {
    auStack_140[lVar9 + 2] = 0;
  }
  auStack_140[0x11] = 0x40;
  for (lVar9 = 0x10; lVar9 != 0x40; lVar9 = lVar9 + 1) {
    iVar3 = auStack_140[2] + aiStack_154[lVar9];
    auStack_140[2] = auStack_174[lVar9];
    uVar2 = auStack_140[lVar9];
    auStack_140[lVar9 + 2] =
         (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
         (auStack_140[2] >> 3 ^
         (auStack_140[2] << 0xe | auStack_140[2] >> 0x12) ^
         (auStack_140[2] << 0x19 | auStack_140[2] >> 7)) + iVar3;
  }
  uVar2 = 0x3c6ef372;
  uVar8 = 0xbb67ae85;
  uVar1 = 0x1f83d9ab;
  uVar12 = 0x9b05688c;
  uVar11 = 0x510e527f;
  uVar13 = 0x5be0cd19;
  uVar4 = 0x6a09e667;
  uVar14 = 0xa54ff53a;
  for (lVar9 = 0; uVar10 = uVar1, uVar7 = uVar2, lVar9 != 0x100; lVar9 = lVar9 + 4) {
    uVar15 = uVar7 ^ uVar8;
    iVar3 = uVar13 + ((uVar12 ^ uVar10) & uVar11 ^ uVar10) +
            ((uVar11 << 7 | uVar11 >> 0x19) ^
            (uVar11 << 0x15 | uVar11 >> 0xb) ^ (uVar11 << 0x1a | uVar11 >> 6)) +
            *(int *)((long)getVoronoiSHA::K + lVar9) + *(int *)((long)auStack_140 + lVar9 + 8);
    uVar5 = uVar7 & uVar8;
    uVar2 = uVar8;
    uVar8 = uVar4;
    uVar1 = uVar12;
    uVar12 = uVar11;
    uVar11 = uVar14 + iVar3;
    uVar13 = uVar10;
    uVar4 = (uVar5 ^ uVar15 & uVar4) +
            ((uVar4 << 10 | uVar4 >> 0x16) ^
            (uVar4 << 0x13 | uVar4 >> 0xd) ^ (uVar4 << 0x1e | uVar4 >> 2)) + iVar3;
    uVar14 = uVar7;
  }
  uVar8 = uVar8 + 0xbb67ae85;
  uVar6 = (ulong)(uVar4 + 0x6a09e667) << 0x20;
  return uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | ((ulong)uVar8 & 0xff000000) << 8 |
         ((ulong)uVar8 & 0xff0000) << 0x18 | ((ulong)uVar8 & 0xff00) << 0x28 |
         CONCAT44(uVar4 + 0x6a09e667,uVar8) << 0x38;
}

Assistant:

uint64_t getVoronoiSHA(uint64_t seed)
{
    static const uint32_t K[64] = {
        0x428a2f98,0x71374491, 0xb5c0fbcf,0xe9b5dba5,
        0x3956c25b,0x59f111f1, 0x923f82a4,0xab1c5ed5,
        0xd807aa98,0x12835b01, 0x243185be,0x550c7dc3,
        0x72be5d74,0x80deb1fe, 0x9bdc06a7,0xc19bf174,
        0xe49b69c1,0xefbe4786, 0x0fc19dc6,0x240ca1cc,
        0x2de92c6f,0x4a7484aa, 0x5cb0a9dc,0x76f988da,
        0x983e5152,0xa831c66d, 0xb00327c8,0xbf597fc7,
        0xc6e00bf3,0xd5a79147, 0x06ca6351,0x14292967,
        0x27b70a85,0x2e1b2138, 0x4d2c6dfc,0x53380d13,
        0x650a7354,0x766a0abb, 0x81c2c92e,0x92722c85,
        0xa2bfe8a1,0xa81a664b, 0xc24b8b70,0xc76c51a3,
        0xd192e819,0xd6990624, 0xf40e3585,0x106aa070,
        0x19a4c116,0x1e376c08, 0x2748774c,0x34b0bcb5,
        0x391c0cb3,0x4ed8aa4a, 0x5b9cca4f,0x682e6ff3,
        0x748f82ee,0x78a5636f, 0x84c87814,0x8cc70208,
        0x90befffa,0xa4506ceb, 0xbef9a3f7,0xc67178f2,
    };
    static const uint32_t B[8] = {
        0x6a09e667,0xbb67ae85, 0x3c6ef372,0xa54ff53a,
        0x510e527f,0x9b05688c, 0x1f83d9ab,0x5be0cd19,
    };

    uint32_t m[64];
    uint32_t a0,a1,a2,a3,a4,a5,a6,a7;
    uint32_t i, x, y;
    m[0] = BSWAP32((uint32_t)(seed));
    m[1] = BSWAP32((uint32_t)(seed >> 32));
    m[2] = 0x80000000;
    for (i = 3; i < 15; i++)
        m[i] = 0;
    m[15] = 0x00000040;

    for (i = 16; i < 64; ++i)
    {
        m[i] = m[i - 7] + m[i - 16];
        x = m[i - 15];
        m[i] += rotr32(x,7) ^ rotr32(x,18) ^ (x >> 3);
        x = m[i - 2];
        m[i] += rotr32(x,17) ^ rotr32(x,19) ^ (x >> 10);
    }

    a0 = B[0];
    a1 = B[1];
    a2 = B[2];
    a3 = B[3];
    a4 = B[4];
    a5 = B[5];
    a6 = B[6];
    a7 = B[7];

    for (i = 0; i < 64; i++)
    {
        x = a7 + K[i] + m[i];
        x += rotr32(a4,6) ^ rotr32(a4,11) ^ rotr32(a4,25);
        x += (a4 & a5) ^ (~a4 & a6);

        y = rotr32(a0,2) ^ rotr32(a0,13) ^ rotr32(a0,22);
        y += (a0 & a1) ^ (a0 & a2) ^ (a1 & a2);

        a7 = a6;
        a6 = a5;
        a5 = a4;
        a4 = a3 + x;
        a3 = a2;
        a2 = a1;
        a1 = a0;
        a0 = x + y;
    }

    a0 += B[0];
    a1 += B[1];

    return BSWAP32(a0) | ((uint64_t)BSWAP32(a1) << 32);
}